

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

void __thiscall
Js::ConcatStringMulti::ConcatStringMulti
          (ConcatStringMulti *this,uint slotCount,JavascriptString *a1,JavascriptString *a2,
          StaticType *stringTypeStatic)

{
  ConcatStringMulti *addr;
  charcount_t cVar1;
  charcount_t cVar2;
  JavascriptString *pJVar3;
  
  LiteralString::LiteralString((LiteralString *)this,stringTypeStatic);
  *(undefined ***)this = &PTR_Finalize_01508ee0;
  this->slotCount = slotCount;
  addr = this + 1;
  memset(addr,0,(ulong)slotCount << 3);
  pJVar3 = CompoundString::GetImmutableOrScriptUnreferencedString(a1);
  Memory::Recycler::WBSetBit((char *)addr);
  *(JavascriptString **)(this + 1) = pJVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pJVar3 = CompoundString::GetImmutableOrScriptUnreferencedString(a2);
  Memory::Recycler::WBSetBit(&this[1].field_0x8);
  *(JavascriptString **)&this[1].field_0x8 = pJVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this[1].field_0x8);
  cVar1 = JavascriptString::GetLength(a1);
  cVar2 = JavascriptString::GetLength(a2);
  JavascriptString::SetLength((JavascriptString *)this,cVar1 + cVar2);
  return;
}

Assistant:

ConcatStringMulti::ConcatStringMulti(uint slotCount, JavascriptString * a1, JavascriptString * a2, StaticType* stringTypeStatic) :
        ConcatStringBase(stringTypeStatic), slotCount(slotCount)
    {
#if DBG
        ClearArray(m_slots, slotCount);
#endif
        m_slots[0] = CompoundString::GetImmutableOrScriptUnreferencedString(a1);
        m_slots[1] = CompoundString::GetImmutableOrScriptUnreferencedString(a2);

        this->SetLength(a1->GetLength() + a2->GetLength());
    }